

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O2

void amrex::average_down_faces(MultiFab *fine,MultiFab *crse,IntVect *ratio,int ngcrse)

{
  BoxArray *ba;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  IndexType IVar6;
  int iVar7;
  ulong uVar8;
  Periodicity *period;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  Real facInv_1;
  Real facInv;
  double dVar18;
  int local_314;
  undefined1 local_2e8 [24];
  pointer local_2d0;
  undefined8 uStack_2c8;
  int local_2c0;
  long local_2a8;
  long local_2a0;
  long local_298;
  int jj;
  undefined8 local_288;
  int local_280;
  uint local_27c;
  int local_278;
  int local_274;
  ulong local_268;
  FabArray<amrex::FArrayBox> *local_260;
  IntVect *local_258;
  FabArray<amrex::FArrayBox> *local_250;
  long local_248;
  ulong local_240;
  long local_238;
  ulong local_230;
  long local_228;
  long local_220;
  BoxArray local_218;
  MFIter mfi;
  
  ba = &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  IVar6 = BATransformer::index_type(&ba->m_bat);
  for (uVar9 = 0; (uVar9 != 3 && ((IVar6.itype >> (uVar9 & 0x1f) & 1) == 0)); uVar9 = uVar9 + 1) {
  }
  if ((2 < uVar9) || ((IVar6.itype & ~(1 << (uVar9 & 0x1f))) != 0)) {
    Abort_host("average_down_faces: not face index type");
  }
  uVar1 = (crse->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  bVar5 = isMFIterSafe((FabArrayBase *)fine,(FabArrayBase *)crse);
  if (bVar5) {
    MFIter::MFIter(&mfi,(FabArrayBase *)crse,true);
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    uVar17 = (ulong)uVar1;
    local_268 = uVar17;
    local_260 = &fine->super_FabArray<amrex::FArrayBox>;
    local_258 = ratio;
    local_250 = &crse->super_FabArray<amrex::FArrayBox>;
    while (mfi.currentIndex < mfi.endIndex) {
      MFIter::growntilebox((Box *)&local_288,&mfi,ngcrse);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_218,&crse->super_FabArray<amrex::FArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)local_2e8,&fine->super_FabArray<amrex::FArrayBox>,&mfi);
      local_248 = (long)local_288._4_4_;
      local_240 = (ulong)local_27c;
      local_238 = (long)local_278;
      local_230 = 0;
      while( true ) {
        iVar7 = local_280;
        if (local_230 == uVar17) break;
        for (; iVar7 <= local_274; iVar7 = iVar7 + 1) {
          uVar1 = ratio->vect[0];
          local_298 = (long)(int)uVar1;
          uVar2 = ratio->vect[1];
          local_2a8 = (long)(int)uVar2;
          uVar3 = ratio->vect[2];
          iVar10 = uVar3 * iVar7;
          uVar17 = 0;
          if (0 < (int)uVar1) {
            uVar17 = (ulong)uVar1;
          }
          uVar8 = 0;
          if (0 < (int)uVar2) {
            uVar8 = (ulong)uVar2;
          }
          uVar4 = uVar3;
          if ((int)uVar3 < 1) {
            uVar4 = 0;
          }
          local_314 = local_288._4_4_ * uVar2;
          lVar12 = local_248;
          while (lVar13 = lVar12, lVar13 <= local_238) {
            if ((int)local_288 <= (int)local_27c) {
              _jj = lVar13 * local_2a8;
              local_220 = (long)local_218.m_bat.m_op.m_bndryReg.m_loshft.vect[2];
              local_228 = local_218.m_bat._0_8_ +
                          ((lVar13 - local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[0]) *
                           local_218.m_bat.m_op._4_8_ +
                          ((long)iVar7 - (long)local_218.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) *
                          local_218.m_bat.m_op._12_8_ + local_218.m_bat.m_op._20_8_ * local_230) * 8
              ;
              lVar12 = (long)(int)local_288;
              iVar16 = (int)local_288 * uVar1;
              do {
                if (uVar9 == 2) {
                  dVar18 = 0.0;
                  for (uVar14 = 0; uVar14 != uVar8; uVar14 = uVar14 + 1) {
                    uVar15 = uVar17;
                    iVar11 = iVar16 - (int)uStack_2c8;
                    while (bVar5 = uVar15 != 0, uVar15 = uVar15 - 1, bVar5) {
                      dVar18 = dVar18 + *(double *)
                                         (local_2e8._0_8_ +
                                         (((long)iVar10 - (long)local_2c0) * local_2e8._16_8_ +
                                         (long)local_2d0 * local_230 +
                                         (long)(((int)_jj + (int)uVar14) - uStack_2c8._4_4_) *
                                         local_2e8._8_8_ + (long)iVar11) * 8);
                      iVar11 = iVar11 + 1;
                    }
                  }
                  dVar18 = dVar18 * (1.0 / (double)(int)(uVar2 * uVar1));
LAB_005382c2:
                  *(double *)(local_228 + (lVar12 - local_220) * 8) = dVar18;
                }
                else {
                  if (uVar9 == 1) {
                    dVar18 = 0.0;
                    for (uVar14 = 0; uVar14 != uVar4; uVar14 = uVar14 + 1) {
                      uVar15 = uVar17;
                      iVar11 = iVar16 - (int)uStack_2c8;
                      while (bVar5 = uVar15 != 0, uVar15 = uVar15 - 1, bVar5) {
                        dVar18 = dVar18 + *(double *)
                                           (local_2e8._0_8_ +
                                           ((_jj - uStack_2c8._4_4_) * local_2e8._8_8_ +
                                           (long)local_2d0 * local_230 +
                                           (long)((iVar10 + (int)uVar14) - local_2c0) *
                                           local_2e8._16_8_ + (long)iVar11) * 8);
                        iVar11 = iVar11 + 1;
                      }
                    }
                    dVar18 = dVar18 * (1.0 / (double)(int)(uVar3 * uVar1));
                    goto LAB_005382c2;
                  }
                  if (uVar9 == 0) {
                    dVar18 = 0.0;
                    for (uVar14 = 0; uVar14 != uVar4; uVar14 = uVar14 + 1) {
                      uVar15 = uVar8;
                      iVar11 = local_314 - uStack_2c8._4_4_;
                      while (bVar5 = uVar15 != 0, uVar15 = uVar15 - 1, bVar5) {
                        dVar18 = dVar18 + *(double *)
                                           (local_2e8._0_8_ +
                                           ((lVar12 * local_298 - (long)(int)uStack_2c8) +
                                           (long)local_2d0 * local_230 +
                                           (long)((iVar10 + (int)uVar14) - local_2c0) *
                                           local_2e8._16_8_ + local_2e8._8_8_ * (long)iVar11) * 8);
                        iVar11 = iVar11 + 1;
                      }
                    }
                    dVar18 = dVar18 * (1.0 / (double)(int)(uVar3 * uVar2));
                    goto LAB_005382c2;
                  }
                }
                lVar12 = lVar12 + 1;
                iVar16 = iVar16 + uVar1;
              } while (local_27c + 1 != (int)lVar12);
            }
            local_314 = local_314 + uVar2;
            local_2a0 = lVar13;
            lVar12 = lVar13 + 1;
          }
          fine = (MultiFab *)local_260;
          uVar17 = local_268;
          crse = (MultiFab *)local_250;
          ratio = local_258;
        }
        local_230 = local_230 + 1;
      }
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
  }
  else {
    coarsen(&local_218,ba,ratio);
    local_2e8._0_8_ = (double *)0x1;
    local_2e8._8_8_ = (Arena *)0x0;
    local_2e8._16_8_ = (pointer)0x0;
    local_2d0 = (pointer)0x0;
    uStack_2c8 = (pointer)0x0;
    local_288 = &PTR__FabFactory_007d2928;
    MultiFab::MultiFab((MultiFab *)&mfi,&local_218,
                       &(fine->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,
                       uVar1,ngcrse,(MFInfo *)local_2e8,(FabFactory<amrex::FArrayBox> *)&local_288);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_2e8 + 0x10));
    BoxArray::~BoxArray(&local_218);
    average_down_faces(fine,(MultiFab *)&mfi,ratio,ngcrse);
    period = Periodicity::NonPeriodic();
    FabArray<amrex::FArrayBox>::ParallelCopy
              (&crse->super_FabArray<amrex::FArrayBox>,(FabArray<amrex::FArrayBox> *)&mfi,0,0,uVar1,
               ngcrse,ngcrse,period,COPY);
    MultiFab::~MultiFab((MultiFab *)&mfi);
  }
  return;
}

Assistant:

void average_down_faces (const MultiFab& fine, MultiFab& crse,
                             const IntVect& ratio, int ngcrse)
    {
        AMREX_ASSERT(crse.nComp() == fine.nComp());
        AMREX_ASSERT(fine.ixType() == crse.ixType());
        const auto type = fine.ixType();
        int dir;
        for (dir = 0; dir < AMREX_SPACEDIM; ++dir) {
            if (type.nodeCentered(dir)) break;
        }
        auto tmptype = type;
        tmptype.unset(dir);
        if (dir >= AMREX_SPACEDIM || !tmptype.cellCentered()) {
            amrex::Abort("average_down_faces: not face index type");
        }
        const int ncomp = crse.nComp();
        if (isMFIterSafe(fine, crse))
        {
#ifdef AMREX_USE_GPU
            if (Gpu::inLaunchRegion() && crse.isFusingCandidate()) {
                auto const& crsema = crse.arrays();
                auto const& finema = fine.const_arrays();
                ParallelFor(crse, IntVect(ngcrse), ncomp,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    amrex_avgdown_faces(i,j,k,n, crsema[box_no], finema[box_no], 0, 0, ratio, dir);
                });
                Gpu::streamSynchronize();
            } else
#endif
            {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
                for (MFIter mfi(crse,TilingIfNotGPU()); mfi.isValid(); ++mfi)
                {
                    const Box& bx = mfi.growntilebox(ngcrse);
                    Array4<Real> const& crsearr = crse.array(mfi);
                    Array4<Real const> const& finearr = fine.const_array(mfi);

                    AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
                    {
                        amrex_avgdown_faces(i,j,k,n, crsearr, finearr, 0, 0, ratio, dir);
                    });
                }
            }
        }
        else
        {
            MultiFab ctmp(amrex::coarsen(fine.boxArray(),ratio), fine.DistributionMap(),
                          ncomp, ngcrse, MFInfo(), FArrayBoxFactory());
            average_down_faces(fine, ctmp, ratio, ngcrse);
            crse.ParallelCopy(ctmp,0,0,ncomp,ngcrse,ngcrse);
        }
    }